

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_difflist * lyd_diff_init_difflist(uint *size)

{
  lyd_difflist *plVar1;
  LYD_DIFFTYPE *pLVar2;
  lyd_node **pplVar3;
  lyd_difflist *result;
  uint *size_local;
  
  plVar1 = (lyd_difflist *)malloc(0x18);
  *size = 1;
  pLVar2 = (LYD_DIFFTYPE *)calloc((ulong)*size,4);
  plVar1->type = pLVar2;
  pplVar3 = (lyd_node **)calloc((ulong)*size,8);
  plVar1->first = pplVar3;
  pplVar3 = (lyd_node **)calloc((ulong)*size,8);
  plVar1->second = pplVar3;
  return plVar1;
}

Assistant:

static struct lyd_difflist *
lyd_diff_init_difflist(unsigned int *size)
{
    struct lyd_difflist *result;

    result = malloc(sizeof *result);
    *size = 1;
    result->type = calloc(*size, sizeof *result->type);
    result->first = calloc(*size, sizeof *result->first);
    result->second = calloc(*size, sizeof *result->second);

    return result;
}